

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-opt64.c
# Opt level: O0

void KeccakP1600_OverwriteBytes(void *state,uchar *data,uint offset,uint length)

{
  uint uVar1;
  uint lanePosition;
  uint in_ECX;
  uint in_EDX;
  uchar *in_RSI;
  uint _bytesInLane;
  uchar *_curData;
  uint _offsetInLane;
  uint _lanePosition;
  uint _sizeLeft;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint offset_00;
  uchar *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (in_EDX == 0) {
    KeccakP1600_OverwriteLanes
              (in_stack_ffffffffffffffd0,
               (uchar *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    KeccakP1600_OverwriteBytesInLane
              ((void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8);
  }
  else {
    uVar1 = in_EDX >> 3;
    lanePosition = in_EDX & 7;
    for (; in_ECX != 0; in_ECX = in_ECX - offset_00) {
      offset_00 = 8 - lanePosition;
      if (in_ECX < 8 - lanePosition) {
        offset_00 = in_ECX;
      }
      KeccakP1600_OverwriteBytesInLane
                ((void *)CONCAT44(in_ECX,uVar1),lanePosition,in_RSI,offset_00,
                 in_stack_ffffffffffffffc8);
      uVar1 = uVar1 + 1;
      lanePosition = 0;
      in_RSI = in_RSI + offset_00;
    }
  }
  return;
}

Assistant:

void KeccakP1600_OverwriteBytes(void *state, const unsigned char *data, unsigned int offset, unsigned int length)
{
    SnP_OverwriteBytes(state, data, offset, length, KeccakP1600_OverwriteLanes, KeccakP1600_OverwriteBytesInLane, 8);
}